

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall
pbrt::ParsedScene::Texture
          (ParsedScene *this,string *name,string *type,string *texname,ParsedParameterVector params,
          FileLoc loc)

{
  undefined8 *puVar1;
  size_t __n;
  FileLoc loc_00;
  polymorphic_allocator<pbrt::ParsedParameter_*> pVar2;
  ParsedParameter **ppPVar3;
  undefined8 uVar4;
  int iVar5;
  vector<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>>>
  *this_00;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_R8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>
  *tex;
  undefined8 *puVar6;
  bool bVar7;
  ParameterDictionary local_b28;
  ParameterDictionary local_ac0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_a58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>
  local_9f8;
  TextureSceneEntity local_660;
  AnimatedTransform local_2e8;
  
  if (this->currentBlock == OptionsBlock) {
    ErrorExit<char_const(&)[8]>
              ((FileLoc *)&params,
               "Scene description must be inside world block; \"%s\" is not allowed.",
               (char (*) [8])0x2818627);
  }
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_a58,in_R8);
  ParameterDictionary::ParameterDictionary
            (&local_b28,&local_a58,&(this->graphicsState).textureAttributes,
             (this->graphicsState).colorSpace);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_a58);
  iVar5 = std::__cxx11::string::compare((char *)type);
  if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)type), iVar5 == 0)) {
    iVar5 = std::__cxx11::string::compare((char *)type);
    this_00 = (vector<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>>>
               *)&this->spectrumTextures;
    if (iVar5 == 0) {
      this_00 = (vector<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>>>
                 *)&this->floatTextures;
    }
    puVar1 = *(undefined8 **)(this_00 + 8);
    for (puVar6 = *(undefined8 **)this_00; puVar6 != puVar1; puVar6 = puVar6 + 0x73) {
      __n = puVar6[1];
      if (__n == name->_M_string_length) {
        if (__n == 0) {
          bVar7 = true;
        }
        else {
          iVar5 = bcmp((void *)*puVar6,(name->_M_dataplus)._M_p,__n);
          bVar7 = iVar5 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if ((bVar7) &&
         (SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                    (&this->super_SceneRepresentation,(FileLoc *)&params,
                     "Redefining texture \"%s\".",name), bVar7)) goto LAB_003443e1;
    }
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::InlinedVector(&local_ac0.params,&local_b28.params);
    uVar4 = params.field_2.fixed[0];
    ppPVar3 = params.ptr;
    pVar2 = params.alloc;
    local_ac0.colorSpace = local_b28.colorSpace;
    RenderFromObject(&local_2e8,this);
    loc_00.filename._M_str = (char *)ppPVar3;
    loc_00.filename._M_len = (size_t)pVar2.memoryResource;
    loc_00._16_8_ = uVar4;
    TextureSceneEntity::TextureSceneEntity(&local_660,texname,&local_ac0,loc_00,&local_2e8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>
    ::pair<pbrt::TextureSceneEntity,_true>(&local_9f8,name,&local_660);
    std::
    vector<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>>>
    ::emplace_back<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>>(this_00,&local_9f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9f8.second.texName._M_dataplus._M_p != &local_9f8.second.texName.field_2) {
      operator_delete(local_9f8.second.texName._M_dataplus._M_p,
                      local_9f8.second.texName.field_2._M_allocated_capacity + 1);
    }
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_9f8.second.super_TransformedSceneEntity.super_SceneEntity.parameters.
                      params);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9f8.second.super_TransformedSceneEntity.super_SceneEntity.name._M_dataplus._M_p !=
        &local_9f8.second.super_TransformedSceneEntity.super_SceneEntity.name.field_2) {
      operator_delete(local_9f8.second.super_TransformedSceneEntity.super_SceneEntity.name.
                      _M_dataplus._M_p,
                      local_9f8.second.super_TransformedSceneEntity.super_SceneEntity.name.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9f8.first._M_dataplus._M_p != &local_9f8.first.field_2) {
      operator_delete(local_9f8.first._M_dataplus._M_p,
                      local_9f8.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_660.texName._M_dataplus._M_p != &local_660.texName.field_2) {
      operator_delete(local_660.texName._M_dataplus._M_p,
                      local_660.texName.field_2._M_allocated_capacity + 1);
    }
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_660.super_TransformedSceneEntity.super_SceneEntity.parameters.params);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_660.super_TransformedSceneEntity.super_SceneEntity.name._M_dataplus._M_p !=
        &local_660.super_TransformedSceneEntity.super_SceneEntity.name.field_2) {
      operator_delete(local_660.super_TransformedSceneEntity.super_SceneEntity.name._M_dataplus._M_p
                      ,local_660.super_TransformedSceneEntity.super_SceneEntity.name.field_2.
                       _M_allocated_capacity + 1);
    }
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_ac0.params);
  }
  else {
    SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
              (&this->super_SceneRepresentation,(FileLoc *)&params,
               "%s: texture type unknown. Must be \"float\" or \"spectrum\".",type);
  }
LAB_003443e1:
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_b28.params);
  return;
}

Assistant:

void ParsedScene::Texture(const std::string &name, const std::string &type,
                          const std::string &texname, ParsedParameterVector params,
                          FileLoc loc) {
    VERIFY_WORLD("Texture");

    ParameterDictionary dict(std::move(params), graphicsState.textureAttributes,
                             graphicsState.colorSpace);

    if (type != "float" && type != "spectrum") {
        ErrorExitDeferred(
            &loc, "%s: texture type unknown. Must be \"float\" or \"spectrum\".", type);
        return;
    }

    std::vector<std::pair<std::string, TextureSceneEntity>> &textures =
        (type == "float") ? floatTextures : spectrumTextures;

    for (const auto &tex : textures)
        if (tex.first == name) {
            ErrorExitDeferred(&loc, "Redefining texture \"%s\".", name);
            return;
        }

    textures.push_back(std::make_pair(
        name, TextureSceneEntity(texname, std::move(dict), loc, RenderFromObject())));
}